

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O1

size_t __thiscall RVO::RVOSimulator::addAgent(RVOSimulator *this,Vector2 *position)

{
  pointer *pppAVar1;
  Agent *pAVar2;
  iterator __position;
  Agent *this_00;
  size_t sVar3;
  Agent *agent;
  Agent *local_20;
  
  if (this->defaultAgent_ == (Agent *)0x0) {
    sVar3 = 0xffffffffffffffff;
  }
  else {
    this_00 = (Agent *)operator_new(0x98);
    Agent::Agent(this_00,this);
    this_00->position_ = *position;
    pAVar2 = this->defaultAgent_;
    this_00->maxNeighbors_ = pAVar2->maxNeighbors_;
    this_00->maxSpeed_ = pAVar2->maxSpeed_;
    this_00->neighborDist_ = pAVar2->neighborDist_;
    this_00->radius_ = pAVar2->radius_;
    this_00->timeHorizon_ = pAVar2->timeHorizon_;
    this_00->timeHorizonObst_ = pAVar2->timeHorizonObst_;
    this_00->velocity_ = pAVar2->velocity_;
    __position._M_current =
         (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    this_00->id_ = (long)__position._M_current -
                   (long)(this->agents_).
                         super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
    if (__position._M_current ==
        (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_20 = this_00;
      std::vector<RVO::Agent*,std::allocator<RVO::Agent*>>::_M_realloc_insert<RVO::Agent*const&>
                ((vector<RVO::Agent*,std::allocator<RVO::Agent*>> *)this,__position,&local_20);
    }
    else {
      *__position._M_current = this_00;
      pppAVar1 = &(this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppAVar1 = *pppAVar1 + 1;
    }
    sVar3 = ((long)(this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
  }
  return sVar3;
}

Assistant:

size_t RVOSimulator::addAgent(const Vector2 &position)
	{
		if (defaultAgent_ == NULL) {
			return RVO_ERROR;
		}

		Agent *agent = new Agent(this);

		agent->position_ = position;
		agent->maxNeighbors_ = defaultAgent_->maxNeighbors_;
		agent->maxSpeed_ = defaultAgent_->maxSpeed_;
		agent->neighborDist_ = defaultAgent_->neighborDist_;
		agent->radius_ = defaultAgent_->radius_;
		agent->timeHorizon_ = defaultAgent_->timeHorizon_;
		agent->timeHorizonObst_ = defaultAgent_->timeHorizonObst_;
		agent->velocity_ = defaultAgent_->velocity_;

		agent->id_ = agents_.size();

		agents_.push_back(agent);

		return agents_.size() - 1;
	}